

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memzero_s.c
# Opt level: O0

errno_t memzero_s(void *dest,rsize_t len)

{
  long lVar1;
  void *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  uint8_t unaff_retaddr;
  uint32_t unaff_retaddr_00;
  errno_t in_stack_ffffffffffffffdc;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (char *)0x0) {
    invoke_safe_mem_constraint_handler((char *)0x0,in_RSI,in_stack_ffffffffffffffdc);
    local_c = 400;
  }
  else if (in_RSI == (void *)0x0) {
    invoke_safe_mem_constraint_handler(in_RDI,(void *)0x0,in_stack_ffffffffffffffdc);
    local_c = 0x191;
  }
  else if (in_RSI < (void *)0x10000001) {
    mem_prim_set((void *)len,unaff_retaddr_00,unaff_retaddr);
    local_c = 0;
  }
  else {
    invoke_safe_mem_constraint_handler(in_RDI,in_RSI,in_stack_ffffffffffffffdc);
    local_c = 0x193;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
memzero_s (void *dest, rsize_t len)
{
    if (dest == NULL) {
        invoke_safe_mem_constraint_handler("memzero_s: dest is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (len == 0) {
        invoke_safe_mem_constraint_handler("memzero_s: len is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (len > RSIZE_MAX_MEM) {
        invoke_safe_mem_constraint_handler("memzero_s: len exceeds max",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    /*
     * mem_prim_set(dest, len, 0xA5);
     * mem_prim_set(dest, len, 0x5A);
     */
    mem_prim_set(dest, len, 0);

    return (RCNEGATE(EOK));
}